

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RowSetTest(RowSet *pRowSet,u8 iBatch,sqlite3_int64 iRowid)

{
  RowSetEntry *pRVar1;
  RowSetEntry *local_50;
  RowSetEntry *pTail;
  RowSetEntry *pAux;
  RowSetEntry **ppPrevTree;
  RowSetEntry *pTree;
  RowSetEntry *p;
  sqlite3_int64 iRowid_local;
  RowSet *pRStack_18;
  u8 iBatch_local;
  RowSet *pRowSet_local;
  
  p = (RowSetEntry *)iRowid;
  pRStack_18 = pRowSet;
  if (iBatch != pRowSet->iBatch) {
    pTree = pRowSet->pEntry;
    iRowid_local._7_1_ = iBatch;
    if (pTree != (RowSetEntry *)0x0) {
      pAux = (RowSetEntry *)&pRowSet->pForest;
      if ((pRowSet->rsFlags & 1) == 0) {
        pTree = rowSetEntrySort(pTree);
      }
      for (ppPrevTree = (RowSetEntry **)pRStack_18->pForest; ppPrevTree != (RowSetEntry **)0x0;
          ppPrevTree = (RowSetEntry **)ppPrevTree[1]) {
        pAux = (RowSetEntry *)(ppPrevTree + 1);
        if (ppPrevTree[2] == (RowSetEntry *)0x0) {
          pRVar1 = rowSetListToTree(pTree);
          ppPrevTree[2] = pRVar1;
          break;
        }
        rowSetTreeToList(ppPrevTree[2],&pTail,&local_50);
        ppPrevTree[2] = (RowSetEntry *)0x0;
        pTree = rowSetEntryMerge(pTail,pTree);
      }
      if (ppPrevTree == (RowSetEntry **)0x0) {
        ppPrevTree = (RowSetEntry **)rowSetEntryAlloc(pRStack_18);
        pAux->v = (i64)ppPrevTree;
        if ((RowSetEntry *)ppPrevTree != (RowSetEntry *)0x0) {
          ((RowSetEntry *)ppPrevTree)->v = 0;
          ((RowSetEntry *)ppPrevTree)->pRight = (RowSetEntry *)0x0;
          pRVar1 = rowSetListToTree(pTree);
          ppPrevTree[2] = pRVar1;
        }
      }
      pRStack_18->pEntry = (RowSetEntry *)0x0;
      pRStack_18->pLast = (RowSetEntry *)0x0;
      pRStack_18->rsFlags = pRStack_18->rsFlags | 1;
    }
    pRStack_18->iBatch = iRowid_local._7_1_;
  }
  ppPrevTree = (RowSetEntry **)pRStack_18->pForest;
  do {
    if (ppPrevTree == (RowSetEntry **)0x0) {
      return 0;
    }
    pTree = ppPrevTree[2];
    while (pTree != (RowSetEntry *)0x0) {
      if (pTree->v < (long)p) {
        pTree = pTree->pRight;
      }
      else {
        if (pTree->v <= (long)p) {
          return 1;
        }
        pTree = pTree->pLeft;
      }
    }
    ppPrevTree = (RowSetEntry **)ppPrevTree[1];
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetTest(RowSet *pRowSet, u8 iBatch, sqlite3_int64 iRowid){
  struct RowSetEntry *p, *pTree;

  /* This routine is never called after sqlite3RowSetNext() */
  assert( pRowSet!=0 && (pRowSet->rsFlags & ROWSET_NEXT)==0 );

  /* Sort entries into the forest on the first test of a new batch 
  */
  if( iBatch!=pRowSet->iBatch ){
    p = pRowSet->pEntry;
    if( p ){
      struct RowSetEntry **ppPrevTree = &pRowSet->pForest;
      if( (pRowSet->rsFlags & ROWSET_SORTED)==0 ){
        p = rowSetEntrySort(p);
      }
      for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
        ppPrevTree = &pTree->pRight;
        if( pTree->pLeft==0 ){
          pTree->pLeft = rowSetListToTree(p);
          break;
        }else{
          struct RowSetEntry *pAux, *pTail;
          rowSetTreeToList(pTree->pLeft, &pAux, &pTail);
          pTree->pLeft = 0;
          p = rowSetEntryMerge(pAux, p);
        }
      }
      if( pTree==0 ){
        *ppPrevTree = pTree = rowSetEntryAlloc(pRowSet);
        if( pTree ){
          pTree->v = 0;
          pTree->pRight = 0;
          pTree->pLeft = rowSetListToTree(p);
        }
      }
      pRowSet->pEntry = 0;
      pRowSet->pLast = 0;
      pRowSet->rsFlags |= ROWSET_SORTED;
    }
    pRowSet->iBatch = iBatch;
  }

  /* Test to see if the iRowid value appears anywhere in the forest.
  ** Return 1 if it does and 0 if not.
  */
  for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
    p = pTree->pLeft;
    while( p ){
      if( p->v<iRowid ){
        p = p->pRight;
      }else if( p->v>iRowid ){
        p = p->pLeft;
      }else{
        return 1;
      }
    }
  }
  return 0;
}